

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

InverseKinematicsRotationParametrization __thiscall
iDynTree::InverseKinematics::rotationParametrization(InverseKinematics *this)

{
  missingIpoptErrorReport();
  return InverseKinematicsRotationParametrizationRollPitchYaw;
}

Assistant:

enum InverseKinematicsRotationParametrization InverseKinematics::rotationParametrization()
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->rotationParametrization();
#else
        missingIpoptErrorReport();
        return InverseKinematicsRotationParametrizationRollPitchYaw;
#endif
    }